

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

string * __thiscall Image::toString_abi_cxx11_(Image *this)

{
  _Setw _Var1;
  ostream *poVar2;
  long *in_RSI;
  string *in_RDI;
  int c;
  int x;
  int y;
  stringstream ss;
  char *local_1f8;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  for (local_19c = 0; local_19c < *(uint *)((long)in_RSI + 0x24); local_19c = local_19c + 1) {
    for (local_1a0 = 0; local_1a0 < *(uint *)(in_RSI + 4); local_1a0 = local_1a0 + 1) {
      for (local_1a4 = 0; local_1a4 < *(uint *)(in_RSI + 5); local_1a4 = local_1a4 + 1) {
        _Var1 = std::setw(3);
        poVar2 = std::operator<<(local_188,_Var1);
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(uint)*(byte *)((long)(int)local_1a4 +
                                                  *in_RSI + (ulong)(local_19c * (int)in_RSI[4] +
                                                                   local_1a0) * 4));
        if (local_1a4 == (int)in_RSI[5] - 1U) {
          local_1f8 = "|";
        }
        else {
          local_1f8 = ",";
        }
        std::operator<<(poVar2,local_1f8);
      }
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string Image::toString() {
  std::stringstream ss;
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        ss << std::setw(3) << (unsigned int) pixels[(y * width + x)].colors[c]
           << (c == colors - 1 ? "|" : ",");
      }
    }
    ss << std::endl;
  }
  return ss.str();
}